

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

RepeatedField<float> * __thiscall
google::protobuf::RepeatedField<float>::operator=
          (RepeatedField<float> *this,RepeatedField<float> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  
  if (this != other) {
    pAVar1 = GetArena(this);
    pAVar2 = GetArena(other);
    if (pAVar1 == pAVar2) {
      InternalSwap(this,other);
    }
    else {
      CopyFrom(this,other);
    }
  }
  return this;
}

Assistant:

inline RepeatedField<Element>& RepeatedField<Element>::operator=(
    RepeatedField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (GetArena() != other.GetArena()
#ifdef PROTOBUF_FORCE_COPY_IN_MOVE
        || GetArena() == nullptr
#endif  // !PROTOBUF_FORCE_COPY_IN_MOVE
    ) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}